

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void countInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  uint uVar1;
  sqlite3_value *psVar2;
  long *plVar3;
  
  plVar3 = (long *)sqlite3_aggregate_context(ctx,8);
  if (argc == 0) {
    if (plVar3 == (long *)0x0) {
      return;
    }
  }
  else {
    psVar2 = *argv;
    uVar1._0_2_ = psVar2->flags;
    uVar1._2_1_ = psVar2->enc;
    uVar1._3_1_ = psVar2->eSubtype;
    if ((0x55555555U >> (uVar1 & 0x1f) & 1) == 0 || plVar3 == (long *)0x0) {
      return;
    }
  }
  *plVar3 = *plVar3 + -1;
  return;
}

Assistant:

static void countInverse(sqlite3_context *ctx, int argc, sqlite3_value **argv){
  CountCtx *p;
  p = sqlite3_aggregate_context(ctx, sizeof(*p));
  /* p is always non-NULL since countStep() will have been called first */
  if( (argc==0 || SQLITE_NULL!=sqlite3_value_type(argv[0])) && ALWAYS(p) ){
    p->n--;
#ifdef SQLITE_DEBUG
    p->bInverse = 1;
#endif
  }
}